

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

Maybe<capnp::_::RawSchema_*&> __thiscall
kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::find<unsigned_long>
          (HashMap<unsigned_long,_capnp::_::RawSchema_*> *this,unsigned_long *key)

{
  Maybe<kj::HashMap<unsigned_long,_capnp::_::RawSchema_*>::Entry_&> MVar1;
  
  MVar1 = Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
          ::find<0ul,unsigned_long&>
                    ((Table<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Entry,kj::HashIndex<kj::HashMap<unsigned_long,capnp::_::RawSchema*>::Callbacks>>
                      *)this,key);
  if (MVar1.ptr != (Entry *)0x0) {
    MVar1.ptr = (Entry *)&(MVar1.ptr)->value;
  }
  return (Maybe<capnp::_::RawSchema_*&>)MVar1.ptr;
}

Assistant:

kj::Maybe<Value&> HashMap<Key, Value>::find(KeyLike&& key) {
  return table.find(key).map([](Entry& e) -> Value& { return e.value; });
}